

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD3Loader.cpp
# Opt level: O3

bool Assimp::Q3Shader::LoadSkin(SkinData *fill,string *pFile,IOSystem *io)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _List_node_base *p_Var3;
  byte bVar4;
  int iVar5;
  undefined4 extraout_var;
  Logger *this;
  long lVar7;
  byte *pbVar8;
  ulong uVar9;
  byte *pbVar10;
  char *pcVar11;
  string ss;
  vector<char,_std::allocator<char>_> _buff;
  char *local_b0;
  ulong local_a8;
  char local_a0 [16];
  TextureEntry local_90;
  vector<char,_std::allocator<char>_> local_48;
  long *plVar6;
  
  paVar1 = &local_90.
            super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .first.field_2;
  local_90.
  super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"rt","");
  iVar5 = (*io->_vptr_IOSystem[4])
                    (io,(pFile->_M_dataplus)._M_p,
                     local_90.
                     super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .first._M_dataplus._M_p);
  plVar6 = (long *)CONCAT44(extraout_var,iVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.
         super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .first._M_dataplus._M_p != paVar1) {
    operator_delete(local_90.
                    super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .first._M_dataplus._M_p);
  }
  if (plVar6 != (long *)0x0) {
    this = DefaultLogger::get();
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_90,
                   "Loading Quake3 skin file ",pFile);
    Logger::info(this,local_90.
                      super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .first._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.
           super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .first._M_dataplus._M_p != paVar1) {
      operator_delete(local_90.
                      super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .first._M_dataplus._M_p);
    }
    lVar7 = (**(code **)(*plVar6 + 0x30))(plVar6);
    std::vector<char,_std::allocator<char>_>::vector
              (&local_48,lVar7 + 1,(allocator_type *)&local_90);
    pbVar10 = (byte *)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start;
    (**(code **)(*plVar6 + 0x10))
              (plVar6,local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,lVar7,1);
    local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar7] = 0;
    for (pbVar8 = (byte *)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start;
        pbVar8 != (byte *)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_finish; pbVar8 = pbVar8 + 1) {
      if (*pbVar8 == 0x2c) {
        *pbVar8 = 0x20;
      }
    }
    bVar4 = *pbVar10;
    while (bVar4 != 0) {
      while ((bVar4 < 0x21 && ((0x100002600U >> ((ulong)bVar4 & 0x3f) & 1) != 0))) {
        bVar4 = pbVar10[1];
        pbVar10 = pbVar10 + 1;
      }
      while ((pbVar8 = pbVar10, bVar4 < 0x21 && ((0x100002600U >> ((ulong)bVar4 & 0x3f) & 1) != 0)))
      {
        bVar4 = pbVar10[1];
        pbVar10 = pbVar10 + 1;
      }
      while ((0x20 < bVar4 || ((0x100003601U >> ((ulong)bVar4 & 0x3f) & 1) == 0))) {
        bVar4 = pbVar8[1];
        pbVar8 = pbVar8 + 1;
      }
      local_b0 = local_a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,pbVar10,pbVar8);
      pcVar11 = local_b0;
      uVar9 = local_a8;
      if (3 < local_a8) {
        uVar9 = 4;
      }
      iVar5 = strncmp(local_b0,"tag_",uVar9);
      paVar2 = &local_90.
                super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .second.field_2;
      pbVar10 = pbVar8;
      if (iVar5 != 0) {
        local_90.
        super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .second.field_2._8_8_ = 0;
        local_90.
        super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .second._M_string_length = 0;
        local_90.
        super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .first.field_2._M_allocated_capacity = 0;
        local_90.
        super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .first.field_2._8_8_ = 0;
        local_90.resolved = false;
        local_90._65_7_ = 0;
        local_90.
        super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .first._M_string_length = 0;
        local_90.
        super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .second.field_2._M_allocated_capacity = 0;
        local_90.
        super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .first._M_dataplus._M_p = (pointer)paVar1;
        local_90.
        super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .second._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::
        list<Assimp::Q3Shader::SkinData::TextureEntry,_std::allocator<Assimp::Q3Shader::SkinData::TextureEntry>_>
        ::_M_insert<Assimp::Q3Shader::SkinData::TextureEntry>
                  (&fill->textures,(iterator)fill,&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90.
               super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .second._M_dataplus._M_p != paVar2) {
          operator_delete(local_90.
                          super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .second._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90.
               super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .first._M_dataplus._M_p != paVar1) {
          operator_delete(local_90.
                          super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .first._M_dataplus._M_p);
        }
        p_Var3 = (fill->textures).
                 super__List_base<Assimp::Q3Shader::SkinData::TextureEntry,_std::allocator<Assimp::Q3Shader::SkinData::TextureEntry>_>
                 ._M_impl._M_node.super__List_node_base._M_prev;
        std::__cxx11::string::_M_assign((string *)(p_Var3 + 1));
        while ((uVar9 = (ulong)*pbVar8, pbVar10 = pbVar8, uVar9 < 0x21 &&
               ((0x100002600U >> (uVar9 & 0x3f) & 1) != 0))) {
          pbVar8 = pbVar8 + 1;
        }
        while ((0x20 < (byte)uVar9 || ((0x100003601U >> (uVar9 & 0x3f) & 1) == 0))) {
          uVar9 = (ulong)pbVar10[1];
          pbVar10 = pbVar10 + 1;
        }
        local_90.
        super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .first._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,pbVar8,pbVar10);
        std::__cxx11::string::operator=((string *)(p_Var3 + 3),(string *)&local_90);
        pcVar11 = local_b0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90.
               super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .first._M_dataplus._M_p != paVar1) {
          operator_delete(local_90.
                          super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .first._M_dataplus._M_p);
          pcVar11 = local_b0;
        }
      }
      if (pcVar11 != local_a0) {
        operator_delete(pcVar11);
      }
      bVar4 = *pbVar10;
    }
    if ((byte *)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start != (byte *)0x0) {
      operator_delete(local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    (**(code **)(*plVar6 + 8))(plVar6);
  }
  return plVar6 != (long *)0x0;
}

Assistant:

bool Q3Shader::LoadSkin(SkinData& fill, const std::string& pFile,IOSystem* io)
{
    std::unique_ptr<IOStream> file( io->Open( pFile, "rt"));
    if (!file.get())
        return false; // if we can't access the file, don't worry and return

    ASSIMP_LOG_INFO("Loading Quake3 skin file " + pFile);

    // read file in memory
    const size_t s = file->FileSize();
    std::vector<char> _buff(s+1);const char* buff = &_buff[0];
    file->Read(&_buff[0],s,1);
    _buff[s] = 0;

    // remove commas
    std::replace(_buff.begin(),_buff.end(),',',' ');

    // read token by token and fill output table
    for (;*buff;) {
        SkipSpacesAndLineEnd(&buff);

        // get first identifier
        std::string ss = GetNextToken(buff);

        // ignore tokens starting with tag_
        if (!::strncmp(&ss[0],"tag_",std::min((size_t)4, ss.length())))
            continue;

        fill.textures.push_back(SkinData::TextureEntry());
        SkinData::TextureEntry &entry = fill.textures.back();

        entry.first  = ss;
        entry.second = GetNextToken(buff);
    }
    return true;
}